

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O0

char * cmSourceFileGetProperty(void *arg,char *prop)

{
  cmSourceFile *this;
  cmPropertyMap *pcVar1;
  cmCPluginAPISourceFile *__s;
  int iVar2;
  allocator<char> local_99;
  string local_98;
  cmValue local_78 [3];
  allocator<char> local_59;
  string local_58;
  cmValue local_38;
  cmSourceFile *local_30;
  cmSourceFile *rsf;
  cmCPluginAPISourceFile *sf;
  char *prop_local;
  void *arg_local;
  
  this = *arg;
  local_30 = this;
  rsf = (cmSourceFile *)arg;
  sf = (cmCPluginAPISourceFile *)prop;
  prop_local = (char *)arg;
  if (this == (cmSourceFile *)0x0) {
    iVar2 = strcmp(prop,"LOCATION");
    __s = sf;
    if (iVar2 == 0) {
      arg_local = (void *)std::__cxx11::string::c_str();
    }
    else {
      pcVar1 = &rsf->Properties;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,(char *)__s,&local_99);
      local_78[0] = cmPropertyMap::GetPropertyValue
                              ((cmPropertyMap *)&(pcVar1->Map_)._M_h._M_single_bucket,&local_98);
      arg_local = cmValue::GetCStr(local_78);
      std::__cxx11::string::~string((string *)&local_98);
      std::allocator<char>::~allocator(&local_99);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,prop,&local_59);
    local_38 = cmSourceFile::GetProperty(this,&local_58);
    arg_local = cmValue::GetCStr(&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator(&local_59);
  }
  return (char *)arg_local;
}

Assistant:

static const char* CCONV cmSourceFileGetProperty(void* arg, const char* prop)
{
  cmCPluginAPISourceFile* sf = static_cast<cmCPluginAPISourceFile*>(arg);
  if (cmSourceFile* rsf = sf->RealSourceFile) {
    return rsf->GetProperty(prop).GetCStr();
  }
  if (!strcmp(prop, "LOCATION")) {
    return sf->FullPath.c_str();
  }
  return sf->Properties.GetPropertyValue(prop).GetCStr();
}